

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat4 * dja::mat4::homogeneous::orthographic
                 (mat4 *__return_storage_ptr__,float_t left,float_t right,float_t bottom,float_t top
                 ,float_t zNear,float_t zFar)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if ((left != right) || (NAN(left) || NAN(right))) {
    if ((bottom != top) || (NAN(bottom) || NAN(top))) {
      if ((zNear != zFar) || (NAN(zNear) || NAN(zFar))) {
        fVar3 = 1.0 / (right - left);
        fVar1 = 1.0 / (top - bottom);
        fVar2 = 1.0 / (zFar - zNear);
        __return_storage_ptr__->m[0].x = 0.0;
        __return_storage_ptr__->m[0].y = fVar3 + fVar3;
        __return_storage_ptr__->m[0].z = 0.0;
        __return_storage_ptr__->m[0].w = -(left + right) * fVar3;
        __return_storage_ptr__->m[1].x = 0.0;
        __return_storage_ptr__->m[1].y = 0.0;
        __return_storage_ptr__->m[1].z = fVar1 * 2.0;
        __return_storage_ptr__->m[1].w = -(bottom + top) * fVar1;
        __return_storage_ptr__->m[2].x = fVar2 * -2.0;
        __return_storage_ptr__->m[2].y = 0.0;
        __return_storage_ptr__->m[2].z = 0.0;
        __return_storage_ptr__->m[2].w = -(zNear + zFar) * fVar2;
        __return_storage_ptr__->m[3].x = 0.0;
        __return_storage_ptr__->m[3].y = 0.0;
        __return_storage_ptr__->m[3].z = 0.0;
        __return_storage_ptr__->m[3].w = 1.0;
        return __return_storage_ptr__;
      }
    }
  }
  __assert_fail("left != right && bottom != top && zNear != zFar",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_algebra/dj_algebra.h"
                ,0x35c,
                "static mat4 dja::mat4::homogeneous::orthographic(float_t, float_t, float_t, float_t, float_t, float_t)"
               );
}

Assistant:

mat4
mat4::homogeneous::orthographic(
    float_t left, float_t right,
    float_t bottom, float_t top,
    float_t zNear, float_t zFar
) {
    DJA_ASSERT(left != right && bottom != top && zNear != zFar);
    float_t c1 = float_t(1) / (right - left);
    float_t c2 = float_t(1) / (top - bottom);
    float_t c3 = float_t(1) / (zFar - zNear);
    float_t d1 = float_t(2) * c1;
    float_t d2 = float_t(2) * c2;
    float_t d3 = -float_t(2) * c3;
    float_t tx = -(right + left) * c1;
    float_t ty = -(top + bottom) * c2;
    float_t tz = -(zFar + zNear) * c3;

#if 0 // Standard OpenGL
    return mat4(d1, 0 , 0 , tx,
                0 , d2, 0 , ty,
                0 , 0 , d3, tz,
                0 , 0 , 0 ,  1);
#else // XYZ -> OpenGL
    return mat4(0 , d1, 0 , tx,
                0 , 0 , d2, ty,
                d3, 0 , 0 , tz,
                0 , 0 , 0 ,  1);
#endif
}